

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall gl4cts::GPUShaderFP64Test3::testInit(GPUShaderFP64Test3 *this)

{
  vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
  *this_00;
  pointer *ppuVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  iterator iVar5;
  undefined1 local_40 [16];
  undefined8 local_30;
  char *pcStack_28;
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  this_00 = &this->m_uniform_details;
  local_40._0_4_ = 0x30;
  local_40._8_8_ = "double_value";
  local_30 = &DAT_100000001;
  pcStack_28 = "double";
  iVar5._M_current =
       (this->m_uniform_details).
       super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->m_uniform_details).
      super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test3::uniformDetails>
              (this_00,iVar5,(uniformDetails *)local_40);
    iVar5._M_current =
         (this->m_uniform_details).
         super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *(undefined1 **)&(iVar5._M_current)->m_n_columns = &DAT_100000001;
    (iVar5._M_current)->m_type_name = "double";
    *(ulong *)iVar5._M_current = CONCAT44(local_40._4_4_,0x30);
    (iVar5._M_current)->m_name = "double_value";
    iVar5._M_current =
         (this->m_uniform_details).
         super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->m_uniform_details).
    super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_40._0_4_ = 0x40;
  local_40._8_8_ = "dvec2_value";
  local_30._0_4_ = 1;
  local_30._4_4_ = 2;
  pcStack_28 = "dvec2";
  if (iVar5._M_current ==
      (this->m_uniform_details).
      super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test3::uniformDetails>
              (this_00,iVar5,(uniformDetails *)local_40);
    iVar5._M_current =
         (this->m_uniform_details).
         super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar5._M_current)->m_n_columns = 1;
    (iVar5._M_current)->m_n_elements = 2;
    (iVar5._M_current)->m_type_name = "dvec2";
    *(ulong *)iVar5._M_current = CONCAT44(local_40._4_4_,0x40);
    (iVar5._M_current)->m_name = "dvec2_value";
    iVar5._M_current =
         (this->m_uniform_details).
         super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->m_uniform_details).
    super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_40._0_4_ = 0x60;
  local_40._8_8_ = "dvec3_value";
  local_30._0_4_ = 1;
  local_30._4_4_ = 3;
  pcStack_28 = "dvec3";
  if (iVar5._M_current ==
      (this->m_uniform_details).
      super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test3::uniformDetails>
              (this_00,iVar5,(uniformDetails *)local_40);
    iVar5._M_current =
         (this->m_uniform_details).
         super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar5._M_current)->m_n_columns = 1;
    (iVar5._M_current)->m_n_elements = 3;
    (iVar5._M_current)->m_type_name = "dvec3";
    *(ulong *)iVar5._M_current = CONCAT44(local_40._4_4_,0x60);
    (iVar5._M_current)->m_name = "dvec3_value";
    iVar5._M_current =
         (this->m_uniform_details).
         super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->m_uniform_details).
    super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_40._0_4_ = 0xc0;
  local_40._8_8_ = "dvec4_value";
  local_30._0_4_ = 1;
  local_30._4_4_ = 4;
  pcStack_28 = "dvec4";
  if (iVar5._M_current ==
      (this->m_uniform_details).
      super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test3::uniformDetails>
              (this_00,iVar5,(uniformDetails *)local_40);
    iVar5._M_current =
         (this->m_uniform_details).
         super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar5._M_current)->m_n_columns = 1;
    (iVar5._M_current)->m_n_elements = 4;
    (iVar5._M_current)->m_type_name = "dvec4";
    *(ulong *)iVar5._M_current = CONCAT44(local_40._4_4_,0xc0);
    (iVar5._M_current)->m_name = "dvec4_value";
    iVar5._M_current =
         (this->m_uniform_details).
         super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->m_uniform_details).
    super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_40._0_4_ = 0x110;
  local_40._8_8_ = "dmat2_value";
  local_30._0_4_ = 2;
  local_30._4_4_ = 4;
  pcStack_28 = "dmat2";
  if (iVar5._M_current ==
      (this->m_uniform_details).
      super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test3::uniformDetails>
              (this_00,iVar5,(uniformDetails *)local_40);
    iVar5._M_current =
         (this->m_uniform_details).
         super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar5._M_current)->m_n_columns = 2;
    (iVar5._M_current)->m_n_elements = 4;
    (iVar5._M_current)->m_type_name = "dmat2";
    *(ulong *)iVar5._M_current = CONCAT44(local_40._4_4_,0x110);
    (iVar5._M_current)->m_name = "dmat2_value";
    iVar5._M_current =
         (this->m_uniform_details).
         super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->m_uniform_details).
    super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_40._0_4_ = 0x140;
  local_40._8_8_ = "dmat3_value";
  local_30._0_4_ = 3;
  local_30._4_4_ = 9;
  pcStack_28 = "dmat3";
  if (iVar5._M_current ==
      (this->m_uniform_details).
      super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test3::uniformDetails>
              (this_00,iVar5,(uniformDetails *)local_40);
    iVar5._M_current =
         (this->m_uniform_details).
         super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar5._M_current)->m_n_columns = 3;
    (iVar5._M_current)->m_n_elements = 9;
    (iVar5._M_current)->m_type_name = "dmat3";
    *(ulong *)iVar5._M_current = CONCAT44(local_40._4_4_,0x140);
    (iVar5._M_current)->m_name = "dmat3_value";
    iVar5._M_current =
         (this->m_uniform_details).
         super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->m_uniform_details).
    super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_40._0_4_ = 0x1c0;
  local_40._8_8_ = "dmat4_value";
  local_30._0_4_ = 4;
  local_30._4_4_ = 0x10;
  pcStack_28 = "dmat4";
  if (iVar5._M_current ==
      (this->m_uniform_details).
      super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test3::uniformDetails>
              (this_00,iVar5,(uniformDetails *)local_40);
    iVar5._M_current =
         (this->m_uniform_details).
         super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar5._M_current)->m_n_columns = 4;
    (iVar5._M_current)->m_n_elements = 0x10;
    (iVar5._M_current)->m_type_name = "dmat4";
    *(ulong *)iVar5._M_current = CONCAT44(local_40._4_4_,0x1c0);
    (iVar5._M_current)->m_name = "dmat4_value";
    iVar5._M_current =
         (this->m_uniform_details).
         super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->m_uniform_details).
    super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_40._0_4_ = 0x240;
  local_40._8_8_ = "dmat2x3_value";
  local_30._0_4_ = 2;
  local_30._4_4_ = 6;
  pcStack_28 = "dmat2x3";
  if (iVar5._M_current ==
      (this->m_uniform_details).
      super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test3::uniformDetails>
              (this_00,iVar5,(uniformDetails *)local_40);
    iVar5._M_current =
         (this->m_uniform_details).
         super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar5._M_current)->m_n_columns = 2;
    (iVar5._M_current)->m_n_elements = 6;
    (iVar5._M_current)->m_type_name = "dmat2x3";
    *(ulong *)iVar5._M_current = CONCAT44(local_40._4_4_,0x240);
    (iVar5._M_current)->m_name = "dmat2x3_value";
    iVar5._M_current =
         (this->m_uniform_details).
         super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->m_uniform_details).
    super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_40._0_4_ = 0x2a0;
  local_40._8_8_ = "dmat2x4_value";
  local_30._0_4_ = 2;
  local_30._4_4_ = 8;
  pcStack_28 = "dmat2x4";
  if (iVar5._M_current ==
      (this->m_uniform_details).
      super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test3::uniformDetails>
              (this_00,iVar5,(uniformDetails *)local_40);
    iVar5._M_current =
         (this->m_uniform_details).
         super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar5._M_current)->m_n_columns = 2;
    (iVar5._M_current)->m_n_elements = 8;
    (iVar5._M_current)->m_type_name = "dmat2x4";
    *(ulong *)iVar5._M_current = CONCAT44(local_40._4_4_,0x2a0);
    (iVar5._M_current)->m_name = "dmat2x4_value";
    iVar5._M_current =
         (this->m_uniform_details).
         super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->m_uniform_details).
    super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_40._0_4_ = 0x2e0;
  local_40._8_8_ = "dmat3x2_value";
  local_30._0_4_ = 3;
  local_30._4_4_ = 6;
  pcStack_28 = "dmat3x2";
  if (iVar5._M_current ==
      (this->m_uniform_details).
      super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test3::uniformDetails>
              (this_00,iVar5,(uniformDetails *)local_40);
    iVar5._M_current =
         (this->m_uniform_details).
         super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar5._M_current)->m_n_columns = 3;
    (iVar5._M_current)->m_n_elements = 6;
    (iVar5._M_current)->m_type_name = "dmat3x2";
    *(ulong *)iVar5._M_current = CONCAT44(local_40._4_4_,0x2e0);
    (iVar5._M_current)->m_name = "dmat3x2_value";
    iVar5._M_current =
         (this->m_uniform_details).
         super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->m_uniform_details).
    super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_40._0_4_ = 800;
  local_40._8_8_ = "dmat3x4_value";
  local_30._0_4_ = 3;
  local_30._4_4_ = 0xc;
  pcStack_28 = "dmat3x4";
  if (iVar5._M_current ==
      (this->m_uniform_details).
      super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test3::uniformDetails>
              (this_00,iVar5,(uniformDetails *)local_40);
    iVar5._M_current =
         (this->m_uniform_details).
         super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar5._M_current)->m_n_columns = 3;
    (iVar5._M_current)->m_n_elements = 0xc;
    (iVar5._M_current)->m_type_name = "dmat3x4";
    *(ulong *)iVar5._M_current = CONCAT44(local_40._4_4_,800);
    (iVar5._M_current)->m_name = "dmat3x4_value";
    iVar5._M_current =
         (this->m_uniform_details).
         super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->m_uniform_details).
    super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_40._0_4_ = 0x390;
  local_40._8_8_ = "dmat4x2_value";
  local_30._0_4_ = 4;
  local_30._4_4_ = 8;
  pcStack_28 = "dmat4x2";
  if (iVar5._M_current ==
      (this->m_uniform_details).
      super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test3::uniformDetails>
              (this_00,iVar5,(uniformDetails *)local_40);
    iVar5._M_current =
         (this->m_uniform_details).
         super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar5._M_current)->m_n_columns = 4;
    (iVar5._M_current)->m_n_elements = 8;
    (iVar5._M_current)->m_type_name = "dmat4x2";
    *(ulong *)iVar5._M_current = CONCAT44(local_40._4_4_,0x390);
    (iVar5._M_current)->m_name = "dmat4x2_value";
    iVar5._M_current =
         (this->m_uniform_details).
         super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->m_uniform_details).
    super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_40._0_4_ = 0x3e0;
  local_40._8_8_ = "dmat4x3_value";
  local_30._0_4_ = 4;
  local_30._4_4_ = 0xc;
  pcStack_28 = "dmat4x3";
  if (iVar5._M_current ==
      (this->m_uniform_details).
      super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test3::uniformDetails>
              (this_00,iVar5,(uniformDetails *)local_40);
  }
  else {
    (iVar5._M_current)->m_n_columns = 4;
    (iVar5._M_current)->m_n_elements = 0xc;
    (iVar5._M_current)->m_type_name = "dmat4x3";
    *(ulong *)iVar5._M_current = CONCAT44(local_40._4_4_,0x3e0);
    (iVar5._M_current)->m_name = "dmat4x3_value";
    ppuVar1 = &(this->m_uniform_details).
               super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  iVar2 = rand();
  this->m_base_element = (double)(iVar2 % 0xd);
  iVar2 = rand();
  this->m_base_type_ordinal = (double)(iVar2 % 0xd5);
  prepareProgram(this,&this->m_packed_program,PACKED);
  prepareProgram(this,&this->m_shared_program,SHARED);
  prepareProgram(this,&this->m_std140_program,STD140);
  (**(code **)(lVar4 + 0x6c8))(1,&this->m_transform_feedback_buffer_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"GenBuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1506);
  (**(code **)(lVar4 + 0x6c8))(1,&this->m_uniform_buffer_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"GenBuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1509);
  (**(code **)(lVar4 + 0x40))(0x8c8e,this->m_transform_feedback_buffer_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x150d);
  (**(code **)(lVar4 + 0x150))(0x8c8e,0x10,0,0x88ea);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"BufferData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1510);
  (**(code **)(lVar4 + 0x6f8))(1,&this->m_color_texture_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"GenTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1514);
  (**(code **)(lVar4 + 0xb8))(0xde1,this->m_color_texture_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1517);
  (**(code **)(lVar4 + 0x1380))(0xde1,1,0x8235,1,1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"TexStorage2D",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x151a);
  (**(code **)(lVar4 + 0x6d0))(1,&this->m_framebuffer_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"GenFramebuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x151e);
  (**(code **)(lVar4 + 0x78))(0x8ca9,this->m_framebuffer_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"BindFramebuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1521);
  (**(code **)(lVar4 + 0x6a0))(0x8ca9,0x8ce0,0xde1,this->m_color_texture_id,0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"FramebufferTexture2D",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1525);
  (**(code **)(lVar4 + 0x1a00))(0,0,1,1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Viewport",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1528);
  (**(code **)(lVar4 + 0x708))(1,&this->m_vertex_array_object_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"GenVertexArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x152c);
  (**(code **)(lVar4 + 0xd8))(this->m_vertex_array_object_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"BindVertexArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x152f);
  (**(code **)(lVar4 + 0xfd8))(0x8e72,1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"PatchParameteri",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1533);
  return;
}

Assistant:

void GPUShaderFP64Test3::testInit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Uniform block declaration with std140 offsets calculated
	 *                       | align | loc_req | begins | ends | offset in bytes | imp |
	 * ivec3   dummy1[3]     |     4 |      12 |      0 |   12 |               0 |     |
	 * double  double_value  |     2 |       2 |     12 |   14 |              48 | XXX |
	 * bool    dummy2        |     1 |       1 |     14 |   15 |              56 |     |
	 * dvec2   dvec2_value   |     4 |       4 |     16 |   20 |              64 | XXX |
	 * bvec3   dummy3        |     4 |       4 |     20 |   24 |              80 |     |
	 * dvec3   dvec3_value   |     8 |       8 |     24 |   32 |              96 | XXX |
	 * int     dummy4[3]     |     4 |      12 |     32 |   44 |             128 |     |
	 * dvec4   dvec4_value   |     8 |       8 |     48 |   56 |             192 | XXX |
	 * bool    dummy5        |     1 |       1 |     56 |   57 |             224 |     |
	 * bool    dummy6[2]     |     4 |       8 |     60 |   68 |             240 |     |
	 * dmat2   dmat2_value   |     4 |       8 |     68 |   76 |             272 | XXX |
	 * dmat3   dmat3_value   |     8 |      24 |     80 |  104 |             320 | XXX |
	 * bool    dummy7        |     1 |       1 |    104 |  105 |             416 |     |
	 * dmat4   dmat4_value   |     8 |      32 |    112 |  144 |             448 | XXX |
	 * dmat2x3 dmat2x3_value |     8 |      16 |    144 |  160 |             576 | XXX |
	 * uvec3   dummy8        |     4 |       4 |    160 |  164 |             640 |     |
	 * dmat2x4 dmat2x4_value |     8 |      16 |    168 |  184 |             672 | XXX |
	 * dmat3x2 dmat3x2_value |     4 |      12 |    184 |  196 |             736 | XXX |
	 * bool    dummy9        |     1 |       1 |    196 |  197 |             784 |     |
	 * dmat3x4 dmat3x4_value |     8 |      24 |    200 |  224 |             800 | XXX |
	 * int     dummy10       |     1 |       1 |    224 |  225 |             896 |     |
	 * dmat4x2 dmat4x2_value |     4 |      16 |    228 |  244 |             912 | XXX |
	 * dmat4x3 dmat4x3_value |     8 |      32 |    248 |  280 |             992 | XXX |
	 */

	/* Prepare "double precision" unfiorms' details */
	m_uniform_details.push_back(uniformDetails(48 /* off */, "double_value" /* name */, 1 /* n_columns */,
											   1 /* n_elements */, "double" /* type_name */));
	m_uniform_details.push_back(uniformDetails(64 /* off */, "dvec2_value" /* name */, 1 /* n_columns */,
											   2 /* n_elements */, "dvec2" /* type_name */));
	m_uniform_details.push_back(uniformDetails(96 /* off */, "dvec3_value" /* name */, 1 /* n_columns */,
											   3 /* n_elements */, "dvec3" /* type_name */));
	m_uniform_details.push_back(uniformDetails(192 /* off */, "dvec4_value" /* name */, 1 /* n_columns */,
											   4 /* n_elements */, "dvec4" /* type_name */));
	m_uniform_details.push_back(uniformDetails(272 /* off */, "dmat2_value" /* name */, 2 /* n_columns */,
											   4 /* n_elements */, "dmat2" /* type_name */));
	m_uniform_details.push_back(uniformDetails(320 /* off */, "dmat3_value" /* name */, 3 /* n_columns */,
											   9 /* n_elements */, "dmat3" /* type_name */));
	m_uniform_details.push_back(uniformDetails(448 /* off */, "dmat4_value" /* name */, 4 /* n_columns */,
											   16 /* n_elements */, "dmat4" /* type_name */));
	m_uniform_details.push_back(uniformDetails(576 /* off */, "dmat2x3_value" /* name */, 2 /* n_columns */,
											   6 /* n_elements */, "dmat2x3" /* type_name */));
	m_uniform_details.push_back(uniformDetails(672 /* off */, "dmat2x4_value" /* name */, 2 /* n_columns */,
											   8 /* n_elements */, "dmat2x4" /* type_name */));
	m_uniform_details.push_back(uniformDetails(736 /* off */, "dmat3x2_value" /* name */, 3 /* n_columns */,
											   6 /* n_elements */, "dmat3x2" /* type_name */));
	m_uniform_details.push_back(uniformDetails(800 /* off */, "dmat3x4_value" /* name */, 3 /* n_columns */,
											   12 /* n_elements */, "dmat3x4" /* type_name */));
	m_uniform_details.push_back(uniformDetails(912 /* off */, "dmat4x2_value" /* name */, 4 /* n_columns */,
											   8 /* n_elements */, "dmat4x2" /* type_name */));
	m_uniform_details.push_back(uniformDetails(992 /* off */, "dmat4x3_value" /* name */, 4 /* n_columns */,
											   12 /* n_elements */, "dmat4x3" /* type_name */));

	/* Get random values for getExpectedValue */
	m_base_element		= (glw::GLdouble)(rand() % 13);
	m_base_type_ordinal = (glw::GLdouble)(rand() % 213);

	/* Prepare programInfos for all buffer layouts */
	prepareProgram(m_packed_program, PACKED);
	prepareProgram(m_shared_program, SHARED);
	prepareProgram(m_std140_program, STD140);

	/* Generate buffers */
	gl.genBuffers(1, &m_transform_feedback_buffer_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenBuffers");

	gl.genBuffers(1, &m_uniform_buffer_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenBuffers");

	/* Prepare transform feedback buffer */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_transform_feedback_buffer_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffer");

	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 4 * sizeof(glw::GLint), 0 /* data */, GL_DYNAMIC_COPY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BufferData");

	/* Prepare texture for color attachment 0 */
	gl.genTextures(1, &m_color_texture_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenTextures");

	gl.bindTexture(GL_TEXTURE_2D, m_color_texture_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	gl.texStorage2D(GL_TEXTURE_2D, 1 /* levels */, GL_R32I, 1 /* width */, 1 /* height */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage2D");

	/* Prepare FBO with color attachment 0 */
	gl.genFramebuffers(1, &m_framebuffer_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenFramebuffers");

	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_framebuffer_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindFramebuffer");

	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_color_texture_id,
							0 /* level */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "FramebufferTexture2D");

	gl.viewport(0 /* x */, 0 /* y */, 1 /* width */, 1 /* height */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Viewport");

	/* Prepare VAO */
	gl.genVertexArrays(1, &m_vertex_array_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenVertexArrays");

	gl.bindVertexArray(m_vertex_array_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindVertexArray");

	/* Tesselation patch set up */
	gl.patchParameteri(GL_PATCH_VERTICES, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "PatchParameteri");
}